

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrTsim3.c
# Opt level: O2

void Txs3_ManCollectCone(Txs3_Man_t *p,int fVerbose)

{
  Gia_Man_t *pGVar1;
  int iVar2;
  Gia_Obj_t *pGVar3;
  Vec_Int_t *pVVar4;
  int iVar5;
  
  p->vCiObjs->nSize = 0;
  p->vFosPre->nSize = 0;
  p->vFosAbs->nSize = 0;
  p->vNodes->nSize = 0;
  p->pGia->pObjs->Value = 0xffffffff;
  for (iVar5 = 0; iVar5 < p->vCoObjs->nSize; iVar5 = iVar5 + 1) {
    pGVar1 = p->pGia;
    iVar2 = Vec_IntEntry(p->vCoObjs,iVar5);
    pGVar3 = Gia_ManObj(pGVar1,iVar2);
    if (pGVar3 == (Gia_Obj_t *)0x0) break;
    Txs3_ManCollectCone_rec(p,pGVar3 + -(ulong)((uint)*(undefined8 *)pGVar3 & 0x1fffffff));
  }
  pVVar4 = p->vCiObjs;
  if (fVerbose != 0) {
    printf("%d %d %d \n",(ulong)(uint)pVVar4->nSize,(ulong)(uint)p->vFosPre->nSize,
           (ulong)(uint)p->vFosAbs->nSize);
    pVVar4 = p->vCiObjs;
  }
  iVar5 = pVVar4->nSize;
  p->nPiLits = iVar5;
  Vec_IntSelectSort(pVVar4->pArray,iVar5);
  Vec_IntSelectSortReverse(p->vFosPre->pArray,p->vFosPre->nSize);
  for (iVar5 = 0; iVar5 < p->vFosPre->nSize; iVar5 = iVar5 + 1) {
    iVar2 = Vec_IntEntry(p->vFosPre,iVar5);
    Vec_IntPush(p->vCiObjs,iVar2);
  }
  Vec_IntSelectSortReverse(p->vFosAbs->pArray,p->vFosAbs->nSize);
  for (iVar5 = 0; iVar5 < p->vFosAbs->nSize; iVar5 = iVar5 + 1) {
    iVar2 = Vec_IntEntry(p->vFosAbs,iVar5);
    Vec_IntPush(p->vCiObjs,iVar2);
  }
  for (iVar5 = 0; iVar5 < p->vCiObjs->nSize; iVar5 = iVar5 + 1) {
    pGVar1 = p->pGia;
    iVar2 = Vec_IntEntry(p->vCiObjs,iVar5);
    pGVar3 = Gia_ManObj(pGVar1,iVar2);
    if (pGVar3 == (Gia_Obj_t *)0x0) break;
    pGVar3->Value = 0;
  }
  iVar5 = 0;
  while( true ) {
    if (p->vNodes->nSize <= iVar5) {
      return;
    }
    pGVar1 = p->pGia;
    iVar2 = Vec_IntEntry(p->vNodes,iVar5);
    pGVar3 = Gia_ManObj(pGVar1,iVar2);
    if (pGVar3 == (Gia_Obj_t *)0x0) break;
    pGVar3->Value = 0;
    iVar5 = iVar5 + 1;
  }
  return;
}

Assistant:

void Txs3_ManCollectCone( Txs3_Man_t * p, int fVerbose )
{
    Gia_Obj_t * pObj; int i, Entry;
//    printf( "Collecting cones for clause with %d literals.\n", Vec_IntSize(vCoObjs) );
    Vec_IntClear( p->vCiObjs );
    Vec_IntClear( p->vFosPre );
    Vec_IntClear( p->vFosAbs );
    Vec_IntClear( p->vNodes );
    Gia_ManConst0(p->pGia)->Value = ~0;
    Gia_ManForEachObjVec( p->vCoObjs, p->pGia, pObj, i )
        Txs3_ManCollectCone_rec( p, Gia_ObjFanin0(pObj) );
if ( fVerbose )
printf( "%d %d %d \n", Vec_IntSize(p->vCiObjs), Vec_IntSize(p->vFosPre), Vec_IntSize(p->vFosAbs) );
    p->nPiLits = Vec_IntSize(p->vCiObjs);
    // sort primary inputs
    Vec_IntSelectSort( Vec_IntArray(p->vCiObjs), Vec_IntSize(p->vCiObjs) );
    // sort and add present flop variables
    Vec_IntSelectSortReverse( Vec_IntArray(p->vFosPre), Vec_IntSize(p->vFosPre) );
    Vec_IntForEachEntry( p->vFosPre, Entry, i )
        Vec_IntPush( p->vCiObjs, Entry );
    // sort and add absent flop variables
    Vec_IntSelectSortReverse( Vec_IntArray(p->vFosAbs), Vec_IntSize(p->vFosAbs) );
    Vec_IntForEachEntry( p->vFosAbs, Entry, i )
        Vec_IntPush( p->vCiObjs, Entry );
    // cleanup
    Gia_ManForEachObjVec( p->vCiObjs, p->pGia, pObj, i )
        pObj->Value = 0;
    Gia_ManForEachObjVec( p->vNodes, p->pGia, pObj, i )
        pObj->Value = 0;
}